

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall tree::Tree::changeRoot(Tree *this,string *root)

{
  pointer ppFVar1;
  bool bVar2;
  long lVar3;
  _List_iterator<int> _Var4;
  FileItem *this_00;
  long lVar5;
  pointer ppFVar6;
  ulong uVar7;
  int e;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> child_fileitem;
  FileItem *item;
  pointer pbStack_d0;
  pointer local_c8;
  string line;
  Path local_98;
  FileItem *fileitem;
  string local_70;
  path dir;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&dir,(string *)root);
  bVar2 = boost::filesystem::exists(&dir);
  if (bVar2) {
    line._M_dataplus._M_p._0_4_ = 2;
    _Var4 = std::
            __find_if<std::_List_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<tree::column_const>>
                      ((this->cfg).columns.super__List_base<int,_std::allocator<int>_>._M_impl.
                       _M_node.super__List_node_base._M_next);
    if (_Var4._M_node != (_List_node_base *)&(this->cfg).columns) {
      std::__cxx11::string::string((string *)&local_70,(string *)root);
      FileItem::update_gmap(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::list<int,_std::allocator<int>_>::clear(&this->m_targets);
    uVar8 = (long)(this->m_fileitem).
                  super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_fileitem).
                  super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    e = (int)uVar8;
    erase_entrylist(this,0,e);
    this_00 = (FileItem *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_98,(string *)&dir);
    FileItem::FileItem(this_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    this_00->level = -1;
    this_00->opened_tree = true;
    fileitem = this_00;
    std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::push_back
              (&this->m_fileitem,&fileitem);
    insert_rootcell(this,0);
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    makeline_abi_cxx11_(&line,this,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&ret,&line);
    child_fileitem.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    child_fileitem.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    child_fileitem.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    entryInfoListRecursively
              (this,*(this->m_fileitem).
                     super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl
                     .super__Vector_impl_data._M_start,&child_fileitem);
    ppFVar1 = child_fileitem.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar6 = child_fileitem.
                   super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppFVar6 != ppFVar1; ppFVar6 = ppFVar6 + 1) {
      item = *ppFVar6;
      std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::push_back
                (&this->m_fileitem,&item);
    }
    insert_entrylist(this,&child_fileitem,1,&ret);
    uVar7 = (long)(this->m_fileitem).
                  super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_fileitem).
                  super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar7 < uVar8) {
      item = (FileItem *)0x0;
      pbStack_d0 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      buf_set_lines(this,(int)uVar7,e,true,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&item);
    }
    buf_set_lines(this,0,-1,true,&ret);
    hline(this,0,(int)((ulong)((long)(this->m_fileitem).
                                     super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_fileitem).
                                    super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("change_root Elapsed time:%.9f secs.\n",SUB84((double)(lVar5 - lVar3) / 1000000000.0,0));
    std::_Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::~_Vector_base
              (&child_fileitem.
                super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>);
    std::__cxx11::string::~string((string *)&line);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ret);
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void Tree::changeRoot(const string &root)
{
#ifndef NDEBUG
    auto start_change_root = system_clock::now();
#endif
    // TODO: cursor history
    path dir(root);
    if (!exists(dir)) {
        return;
    }

    // TODO broken when hold on redraw 10s
    auto i = find(cfg.columns.begin(), cfg.columns.end(), GIT);
    if (i != cfg.columns.end()) {
        FileItem::update_gmap(root);
    }
    m_targets.clear();
    const auto old_size = m_fileitem.size();
    erase_entrylist(0, old_size);

    FileItem *fileitem = new FileItem(dir);
    fileitem->level = -1;
    fileitem->opened_tree = true;
    m_fileitem.push_back(fileitem);

    insert_rootcell(0);
    // FIXME: when icon not available
    // col_map[ICON][0].text = "";

    vector<string> ret;
    string line = makeline(0);
    ret.push_back(line);

    vector<FileItem *> child_fileitem;
    entryInfoListRecursively(*m_fileitem[0], child_fileitem);
    for (auto item : child_fileitem) {
        m_fileitem.push_back(item);
    }

    insert_entrylist(child_fileitem, 1, ret);

    // NOTE: The cursor will jump when replacing text with unequal lines
    const auto new_size = m_fileitem.size();
    if (new_size < old_size) {
        buf_set_lines(new_size, old_size, true, {});
    }
    buf_set_lines(0, -1, true, ret);

    hline(0, m_fileitem.size());
#ifndef NDEBUG
    duration<double> time_change_root = system_clock::now() - start_change_root;
    printf("change_root Elapsed time:%.9f secs.\n", time_change_root.count());
#endif
}